

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O2

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionInfo *inlinee,bool isInlined)

{
  Type *this_00;
  int *piVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  Recycler *this_01;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar7;
  FunctionCodeGenJitTimeData *ptr;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x81,"(recycler)","recycler");
    if (!bVar4) goto LAB_00414773;
    *puVar5 = 0;
  }
  pFVar6 = GetFunctionBody(this);
  if (pFVar6 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x83,"(functionBody)","functionBody");
    if (!bVar4) goto LAB_00414773;
    *puVar5 = 0;
  }
  if (pFVar6->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x84,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar4) goto LAB_00414773;
    *puVar5 = 0;
  }
  if (inlinee == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x85,"(inlinee)","inlinee");
    if (!bVar4) {
LAB_00414773:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this_00 = &this->inlinees;
  pWVar7 = (this->inlinees).ptr;
  data._32_8_ = this;
  if (pWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    data.plusSize = (size_t)pFVar6->profiledCallSiteCount;
    local_70 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_d3658c;
    data.filename._0_4_ = 0x89;
    this_01 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    pWVar7 = Memory::
             AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>,false>
                       ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocZero,0,
                        (ulong)pFVar6->profiledCallSiteCount);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::
    WriteBarrierSet(this_00,pWVar7);
    pWVar7 = this_00->ptr;
  }
  lVar2 = *(long *)((long)&pWVar7->ptr + (ulong)((uint)profiledCallSiteId * 8));
  ptr = New(recycler,inlinee,(EntryPointInfo *)0x0,isInlined);
  pWVar7 = (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)
           ((long)&this_00->ptr->ptr + (ulong)((uint)profiledCallSiteId * 8));
  if (lVar2 == 0) {
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierSet(pWVar7,ptr);
    piVar1 = (int *)(data._32_8_ + 0x78);
    *piVar1 = *piVar1 + 1;
    if (*piVar1 == 0) {
      Throw::OutOfMemory();
    }
  }
  else {
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::operator=(&ptr->next,pWVar7);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierSet
              (this_00->ptr + profiledCallSiteId,ptr);
  }
  return ptr;
}

Assistant:

FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::AddInlinee(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionInfo *const inlinee,
        bool isInlined)
    {
        Assert(recycler);
        const auto functionBody = GetFunctionBody();
        Assert(functionBody);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee);

        if (!inlinees)
        {
            inlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData *), functionBody->GetProfiledCallSiteCount());
        }

        FunctionCodeGenJitTimeData *inlineeData = nullptr;
        if (!inlinees[profiledCallSiteId])
        {
            inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, isInlined);
            inlinees[profiledCallSiteId] = inlineeData;
            if (++inlineeCount == 0)
            {
                Js::Throw::OutOfMemory();
            }
        }
        else
        {
            inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr /* entryPoint */, isInlined);
            // This is polymorphic, chain the data.
            inlineeData->next = inlinees[profiledCallSiteId];
            inlinees[profiledCallSiteId] = inlineeData;
        }
        return inlineeData;
    }